

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameters.c
# Opt level: O2

parameters * parameters_get(int K)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  parameters *in_RDI;
  long lVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  
  if (K < 1) {
LAB_00101c45:
    in_RDI->H = 0;
    in_RDI->B = 0;
    in_RDI->W = 0;
    in_RDI->P = 0;
    in_RDI->P1 = 0;
    in_RDI->U = 0;
    in_RDI->Kprime = 0;
    in_RDI->J = 0;
    in_RDI->L = 0;
    in_RDI->S = 0;
    in_RDI->K = -1;
    return in_RDI;
  }
  lVar10 = 0;
  do {
    lVar7 = lVar10;
    if (lVar7 + 0x14 == 0x2558) goto LAB_00101c45;
    iVar1 = *(int *)((long)&base_param_sets[0].Kprime + lVar7);
    lVar10 = lVar7 + 0x14;
  } while (iVar1 < K);
  iVar2 = *(int *)((long)&base_param_sets[0].J + lVar7);
  iVar3 = *(int *)((long)&base_param_sets[0].S + lVar7);
  iVar4 = *(int *)((long)&base_param_sets[0].H + lVar7);
  iVar5 = *(int *)((long)&base_param_sets[0].W + lVar7);
  iVar9 = iVar3 + iVar4 + iVar1;
  iVar8 = iVar9 - iVar5;
  lVar10 = 0;
  do {
    if (lVar10 == 0x4bc) {
      iVar6 = -1;
      break;
    }
    iVar6 = *(int *)((long)&nextprime_small_primes + lVar10);
    lVar10 = lVar10 + 4;
  } while (iVar6 < iVar8);
  in_RDI->K = K;
  in_RDI->Kprime = iVar1;
  in_RDI->J = iVar2;
  in_RDI->L = iVar9;
  in_RDI->S = iVar3;
  in_RDI->H = iVar4;
  in_RDI->B = iVar5 - iVar3;
  in_RDI->W = iVar5;
  in_RDI->P = iVar8;
  in_RDI->P1 = iVar6;
  in_RDI->U = iVar8 - iVar4;
  return in_RDI;
}

Assistant:

parameters parameters_get(int K)
{
	/* Input validation */
	if (K <= 0) {
		return (parameters){ -1 };
	}

	/* Determine Kprime, J, S, H and W from param_sets */
	parameters R = { .K = K };
	int i;
	for (i = 0; i < base_param_sets_sz; ++i) {
		if (K <= base_param_sets[i].Kprime) {
			const base_param_set* P = &base_param_sets[i];
			R.Kprime = P->Kprime;
			R.J = P->J;
			R.S = P->S;
			R.H = P->H;
			R.W = P->W;
			break;
		}
	}
	if (i == base_param_sets_sz) {
		return (parameters){ -1 };
	}

	/* Assign the remaining variables */
	R.L = R.Kprime + R.S + R.H;
	R.P = R.L - R.W;
	R.P1 = nextprime(R.P);
	R.U = R.P - R.H;
	R.B = R.W - R.S;

	return R;
}